

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

bool __thiscall kj::_::CidrRange::matches(CidrRange *this,sockaddr *addr)

{
  int iVar1;
  bool local_39;
  char *local_28;
  byte *otherBits;
  sockaddr *addr_local;
  CidrRange *this_local;
  
  if (this->family == 2) {
    if (addr->sa_family == 10) {
      iVar1 = memcmp(addr->sa_data + 6,"",0xc);
      if (iVar1 != 0) {
        return false;
      }
      local_28 = addr[1].sa_data + 2;
    }
    else {
      if (addr->sa_family != 2) {
        return false;
      }
      local_28 = addr->sa_data + 2;
    }
  }
  else {
    if (this->family != 10) {
      unreachable();
    }
    if (addr->sa_family != 10) {
      return false;
    }
    local_28 = addr->sa_data + 6;
  }
  iVar1 = memcmp(this->bits,local_28,(ulong)(this->bitCount >> 3));
  if (iVar1 == 0) {
    local_39 = true;
    if (this->bitCount != 0x80) {
      local_39 = (uint)this->bits[this->bitCount >> 3] ==
                 ((uint)(byte)local_28[this->bitCount >> 3] & 0xff00 >> ((byte)this->bitCount & 7));
    }
    this_local._7_1_ = local_39;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CidrRange::matches(const struct sockaddr* addr) const {
  const byte* otherBits;

  switch (family) {
    case AF_INET:
      if (addr->sa_family == AF_INET6) {
        otherBits = reinterpret_cast<const struct sockaddr_in6*>(addr)->sin6_addr.s6_addr;
        static constexpr byte V6MAPPED[12] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0xff };
        if (memcmp(otherBits, V6MAPPED, sizeof(V6MAPPED)) == 0) {
          // We're an ipv4 range and the address is ipv6, but it's a "v6 mapped" address, meaning
          // it's equivalent to an ipv4 address. Try to match against the ipv4 part.
          otherBits = otherBits + sizeof(V6MAPPED);
        } else {
          return false;
        }
      } else if (addr->sa_family == AF_INET) {
        otherBits = reinterpret_cast<const byte*>(
            &reinterpret_cast<const struct sockaddr_in*>(addr)->sin_addr.s_addr);
      } else {
        return false;
      }

      break;

    case AF_INET6:
      if (addr->sa_family != AF_INET6) return false;

      otherBits = reinterpret_cast<const struct sockaddr_in6*>(addr)->sin6_addr.s6_addr;
      break;

    default:
      KJ_UNREACHABLE;
  }

  if (memcmp(bits, otherBits, bitCount / 8) != 0) return false;

  return bitCount == 128 ||
      bits[bitCount / 8] == (otherBits[bitCount / 8] & (0xff00 >> (bitCount % 8)));
}